

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decContext.cpp
# Opt level: O3

decContext * uprv_decContextDefault_63(decContext *context,int32_t kind)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  
  context->digits = 9;
  context->emax = 999999999;
  context->emin = -999999999;
  context->round = DEC_ROUND_HALF_UP;
  context->traps = 0x22df;
  context->status = 0;
  context->clamp = '\0';
  switch(kind << 0x1b | (uint)kind >> 5) {
  case 0:
    return context;
  case 1:
    iVar1 = 7;
    iVar2 = 0x60;
    iVar3 = -0x5f;
    break;
  case 2:
    iVar1 = 0x10;
    iVar2 = 0x180;
    iVar3 = -0x17f;
    break;
  default:
    context->status = 0x80;
    return context;
  case 4:
    iVar1 = 0x22;
    iVar2 = 0x1800;
    iVar3 = -0x17ff;
  }
  context->digits = iVar1;
  context->emax = iVar2;
  context->emin = iVar3;
  context->round = DEC_ROUND_HALF_EVEN;
  context->traps = 0;
  context->clamp = '\x01';
  return context;
}

Assistant:

U_CAPI decContext *  U_EXPORT2 uprv_decContextDefault(decContext *context, Int kind) {
  /* set defaults...  */
  context->digits=9;                         /* 9 digits  */
  context->emax=DEC_MAX_EMAX;                /* 9-digit exponents  */
  context->emin=DEC_MIN_EMIN;                /* .. balanced  */
  context->round=DEC_ROUND_HALF_UP;          /* 0.5 rises  */
  context->traps=DEC_Errors;                 /* all but informational  */
  context->status=0;                         /* cleared  */
  context->clamp=0;                          /* no clamping  */
  #if DECSUBSET
  context->extended=0;                       /* cleared  */
  #endif
  switch (kind) {
    case DEC_INIT_BASE:
      /* [use defaults]  */
      break;
    case DEC_INIT_DECIMAL32:
      context->digits=7;                     /* digits  */
      context->emax=96;                      /* Emax  */
      context->emin=-95;                     /* Emin  */
      context->round=DEC_ROUND_HALF_EVEN;    /* 0.5 to nearest even  */
      context->traps=0;                      /* no traps set  */
      context->clamp=1;                      /* clamp exponents  */
      #if DECSUBSET
      context->extended=1;                   /* set  */
      #endif
      break;
    case DEC_INIT_DECIMAL64:
      context->digits=16;                    /* digits  */
      context->emax=384;                     /* Emax  */
      context->emin=-383;                    /* Emin  */
      context->round=DEC_ROUND_HALF_EVEN;    /* 0.5 to nearest even  */
      context->traps=0;                      /* no traps set  */
      context->clamp=1;                      /* clamp exponents  */
      #if DECSUBSET
      context->extended=1;                   /* set  */
      #endif
      break;
    case DEC_INIT_DECIMAL128:
      context->digits=34;                    /* digits  */
      context->emax=6144;                    /* Emax  */
      context->emin=-6143;                   /* Emin  */
      context->round=DEC_ROUND_HALF_EVEN;    /* 0.5 to nearest even  */
      context->traps=0;                      /* no traps set  */
      context->clamp=1;                      /* clamp exponents  */
      #if DECSUBSET
      context->extended=1;                   /* set  */
      #endif
      break;

    default:                                 /* invalid Kind  */
      /* use defaults, and ..  */
      uprv_decContextSetStatus(context, DEC_Invalid_operation); /* trap  */
    }

  return context;}